

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

void __thiscall cppnet::Address::Address(Address *this,AddressType at)

{
  allocator local_9;
  
  this->_address_type = at;
  std::__cxx11::string::string((string *)&this->_ip,"",&local_9);
  this->_port = 0;
  return;
}

Assistant:

Address::Address(AddressType at):
    _address_type(at),    
    _ip(""),           
    _port(0) {
    
}